

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_get_buffer_block_decorations
          (spvc_compiler compiler,spvc_variable_id id,SpvDecoration **decorations,
          size_t *num_decorations)

{
  SmallVector<SpvDecoration_,_8UL> *pSVar1;
  uint *puVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  __node_base *p_Var5;
  long lVar6;
  _Head_base<0UL,_TemporaryBuffer<SpvDecoration_>_*,_false> local_d8;
  anon_class_8_1_4e5cf973 local_d0;
  SmallVector<unsigned_int,_8UL> local_c8;
  Bitset flags;
  
  spirv_cross::Compiler::get_buffer_block_flags
            (&flags,(compiler->compiler)._M_t.
                    super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                    .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,
             (VariableID)id);
  local_d8._M_head_impl = (TemporaryBuffer<SpvDecoration_> *)operator_new(0x40);
  pSVar1 = &(local_d8._M_head_impl)->buffer;
  (pSVar1->stack_storage).aligned_char[0x10] = '\0';
  (pSVar1->stack_storage).aligned_char[0x11] = '\0';
  (pSVar1->stack_storage).aligned_char[0x12] = '\0';
  (pSVar1->stack_storage).aligned_char[0x13] = '\0';
  (pSVar1->stack_storage).aligned_char[0x14] = '\0';
  (pSVar1->stack_storage).aligned_char[0x15] = '\0';
  (pSVar1->stack_storage).aligned_char[0x16] = '\0';
  (pSVar1->stack_storage).aligned_char[0x17] = '\0';
  pSVar1 = &(local_d8._M_head_impl)->buffer;
  (pSVar1->stack_storage).aligned_char[0x18] = '\0';
  (pSVar1->stack_storage).aligned_char[0x19] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1a] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1b] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1c] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1d] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1e] = '\0';
  (pSVar1->stack_storage).aligned_char[0x1f] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[0] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[1] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[2] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[3] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[4] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[5] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[6] = '\0';
  ((local_d8._M_head_impl)->buffer).stack_storage.aligned_char[7] = '\0';
  pSVar1 = &(local_d8._M_head_impl)->buffer;
  (pSVar1->stack_storage).aligned_char[8] = '\0';
  (pSVar1->stack_storage).aligned_char[9] = '\0';
  (pSVar1->stack_storage).aligned_char[10] = '\0';
  (pSVar1->stack_storage).aligned_char[0xb] = '\0';
  (pSVar1->stack_storage).aligned_char[0xc] = '\0';
  (pSVar1->stack_storage).aligned_char[0xd] = '\0';
  (pSVar1->stack_storage).aligned_char[0xe] = '\0';
  (pSVar1->stack_storage).aligned_char[0xf] = '\0';
  ((local_d8._M_head_impl)->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation =
       (_func_int **)&PTR__TemporaryBuffer_004e8c10;
  ((local_d8._M_head_impl)->buffer).super_VectorView<SpvDecoration_>.buffer_size = 0;
  ((local_d8._M_head_impl)->buffer).super_VectorView<SpvDecoration_>.ptr =
       (SpvDecoration_ *)&((local_d8._M_head_impl)->buffer).stack_storage;
  ((local_d8._M_head_impl)->buffer).buffer_capacity = 8;
  local_d0.bitset =
       (unique_ptr<TemporaryBuffer<SpvDecoration_>,_std::default_delete<TemporaryBuffer<SpvDecoration_>_>_>
        *)&local_d8;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if ((flags.lower >> (uVar4 & 0x3f) & 1) != 0) {
      spvc_compiler_get_buffer_block_decorations::anon_class_8_1_4e5cf973::operator()
                (&local_d0,(uint32_t)uVar4);
    }
  }
  if (flags.higher._M_h._M_element_count != 0) {
    local_c8.super_VectorView<unsigned_int>.ptr = (uint *)&local_c8.stack_storage;
    local_c8.super_VectorView<unsigned_int>.buffer_size = 0;
    local_c8.buffer_capacity = 8;
    spirv_cross::SmallVector<unsigned_int,_8UL>::reserve
              (&local_c8,flags.higher._M_h._M_element_count);
    p_Var5 = &flags.higher._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      spirv_cross::SmallVector<unsigned_int,_8UL>::push_back(&local_c8,(uint *)(p_Var5 + 1));
    }
    std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_c8.super_VectorView<unsigned_int>.ptr,
               (char *)local_c8.super_VectorView<unsigned_int>.ptr +
               local_c8.super_VectorView<unsigned_int>.buffer_size * 4);
    puVar2 = local_c8.super_VectorView<unsigned_int>.ptr;
    lVar3 = local_c8.super_VectorView<unsigned_int>.buffer_size << 2;
    for (lVar6 = 0; lVar3 != lVar6; lVar6 = lVar6 + 4) {
      spvc_compiler_get_buffer_block_decorations::anon_class_8_1_4e5cf973::operator()
                (&local_d0,*(uint32_t *)((char *)puVar2 + lVar6));
    }
    spirv_cross::SmallVector<unsigned_int,_8UL>::~SmallVector(&local_c8);
  }
  local_c8.super_VectorView<unsigned_int>.ptr = (uint *)local_d8._M_head_impl;
  *decorations = ((local_d8._M_head_impl)->buffer).super_VectorView<SpvDecoration_>.ptr;
  *num_decorations = ((local_d8._M_head_impl)->buffer).super_VectorView<SpvDecoration_>.buffer_size;
  local_d8._M_head_impl = (TemporaryBuffer<SpvDecoration_> *)0x0;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&compiler->context->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &local_c8);
  if ((TemporaryBuffer<SpvDecoration_> *)local_c8.super_VectorView<unsigned_int>.ptr !=
      (TemporaryBuffer<SpvDecoration_> *)0x0) {
    (*((ScratchMemoryAllocation *)local_c8.super_VectorView<unsigned_int>.ptr)->
      _vptr_ScratchMemoryAllocation[1])();
  }
  if (local_d8._M_head_impl != (TemporaryBuffer<SpvDecoration_> *)0x0) {
    (*((local_d8._M_head_impl)->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation[1])();
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_buffer_block_decorations(spvc_compiler compiler, spvc_variable_id id,
                                                       const SpvDecoration **decorations, size_t *num_decorations)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto flags = compiler->compiler->get_buffer_block_flags(id);
		auto bitset = spvc_allocate<TemporaryBuffer<SpvDecoration>>();

		flags.for_each_bit([&](uint32_t bit) { bitset->buffer.push_back(static_cast<SpvDecoration>(bit)); });

		*decorations = bitset->buffer.data();
		*num_decorations = bitset->buffer.size();
		compiler->context->allocations.push_back(std::move(bitset));
	}